

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontTests.cpp
# Opt level: O2

void __thiscall agge::tests::FontTests::MissingGlyphIsReportedAsNull(FontTests *this)

{
  element_type *peVar1;
  iterator iVar2;
  allocator local_a1;
  glyph *local_a0;
  LocationInfo local_98;
  string local_70;
  ptr f;
  char_to_index indices [1];
  glyph local_38;
  
  indices[0].symbol = 0x41;
  indices[0].index = 0;
  local_38.metrics.dx = 11.0;
  local_38.metrics.dy = 0.0;
  local_38.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mocks::create_font<1ul,1ul>
            ((mocks *)&f,(font_metrics *)(anonymous_namespace)::c_fm1,&indices,
             (glyph (*) [1])&local_38);
  peVar1 = f.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.filename._M_dataplus._M_p._0_4_ = 2;
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(f.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_glyphs,
                 (key_type *)&local_98);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>._M_cur ==
      (__node_type *)0x0) {
    local_a0 = font::load_glyph(peVar1,(glyph_index_t)local_98.filename._M_dataplus._M_p);
  }
  else {
    local_a0 = (glyph *)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>
                               ._M_cur + 0x10);
  }
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/FontTests.cpp"
             ,&local_a1);
  ut::LocationInfo::LocationInfo(&local_98,&local_70,0x1f);
  ut::is_null<agge::glyph_const*>(&local_a0,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  peVar1 = f.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.filename._M_dataplus._M_p._0_4_ = 0x277f;
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(f.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_glyphs,
                 (key_type *)&local_98);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>._M_cur ==
      (__node_type *)0x0) {
    local_a0 = font::load_glyph(peVar1,(glyph_index_t)local_98.filename._M_dataplus._M_p);
  }
  else {
    local_a0 = (glyph *)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>
                               ._M_cur + 0x10);
  }
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/FontTests.cpp"
             ,&local_a1);
  ut::LocationInfo::LocationInfo(&local_98,&local_70,0x20);
  ut::is_null<agge::glyph_const*>(&local_a0,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  local_98.filename._M_dataplus._M_p._0_4_ = 1;
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(f.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_glyphs,
                 (key_type *)&local_98);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>._M_cur ==
      (__node_type *)0x0) {
    local_a0 = font::load_glyph(f.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                (glyph_index_t)local_98.filename._M_dataplus._M_p);
  }
  else {
    local_a0 = (glyph *)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>
                               ._M_cur + 0x10);
  }
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/FontTests.cpp"
             ,&local_a1);
  ut::LocationInfo::LocationInfo(&local_98,&local_70,0x21);
  ut::is_null<agge::glyph_const*>(&local_a0,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::
  ~_Vector_base(&local_38.outline.
                 super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
               );
  return;
}

Assistant:

test( MissingGlyphIsReportedAsNull )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 0 }, };
				mocks::font_accessor::glyph glyphs[] = { { { 11, 0 } }, };
				font::ptr f = mocks::create_font(c_fm1, indices, glyphs);

				// ACT / ASSERT
				assert_null(f->get_glyph(2));
				assert_null(f->get_glyph(10111));
				assert_null(f->get_glyph(1));
			}